

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

RealType __thiscall
OpenMD::ZConstraintForceModifier::getZTargetPos(ZConstraintForceModifier *this,int index)

{
  double *pdVar1;
  undefined4 in_ESI;
  Vector3d com;
  Molecule *mol;
  RealType zTargetPos;
  undefined4 in_stack_00000028;
  Vector<double,_3U> VStack_38;
  Molecule *local_20;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  local_20 = SimInfo::getMoleculeByGlobalIndex
                       ((SimInfo *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                        (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  Molecule::getCom((Molecule *)CONCAT44(index,in_stack_00000028));
  pdVar1 = Vector<double,_3U>::operator[](&VStack_38,2);
  return *pdVar1;
}

Assistant:

RealType ZConstraintForceModifier::getZTargetPos(int index) {
    RealType zTargetPos;
#ifndef IS_MPI
    Molecule* mol = info_->getMoleculeByGlobalIndex(index);
    assert(mol);
    Vector3d com = mol->getCom();
    zTargetPos   = com[whichDirection];
#else
    int whichProc = info_->getMolToProc(index);
    if (whichProc == worldRank) {
      Molecule* mol = info_->getMoleculeByGlobalIndex(index);
      Vector3d com  = mol->getCom();
      zTargetPos    = com[whichDirection];
      MPI_Bcast(&zTargetPos, 1, MPI_REALTYPE, whichProc, MPI_COMM_WORLD);
    } else {
      MPI_Bcast(&zTargetPos, 1, MPI_REALTYPE, whichProc, MPI_COMM_WORLD);
    }
#endif
    return zTargetPos;
  }